

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_rec rf_get_collision_rec(rf_rec rec1,rf_rec rec2)

{
  float fVar1;
  float fVar2;
  float fVar4;
  undefined8 uVar3;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  rf_rec rVar14;
  
  uVar7 = rec2._0_8_;
  fVar2 = rec1.x;
  fVar4 = rec1.y;
  fVar1 = rec2.x;
  fVar8 = rec2.y;
  fVar9 = rec2.width;
  uVar3 = 0;
  if (((fVar1 + fVar9 <= fVar2) || (fVar5 = rec1.width, fVar2 + fVar5 <= fVar1)) ||
     (fVar10 = rec2.height, fVar8 + fVar10 <= fVar4)) {
    fVar11 = 0.0;
    fVar13 = 0.0;
    goto LAB_0012482b;
  }
  fVar6 = rec1.height;
  fVar11 = 0.0;
  fVar13 = 0.0;
  if (fVar4 + fVar6 <= fVar8) goto LAB_0012482b;
  fVar12 = fVar2 - fVar1;
  fVar13 = fVar6;
  if (fVar2 <= fVar1) {
    fVar2 = fVar1;
    fVar11 = fVar5;
    if (fVar8 < fVar4) goto LAB_00124840;
  }
  else {
    fVar11 = fVar9;
    if (fVar8 < fVar4) {
LAB_00124840:
      uVar7 = CONCAT44(fVar4,fVar2);
      fVar13 = fVar10;
    }
    else {
      uVar7 = CONCAT44(fVar8,fVar2);
    }
  }
  fVar11 = fVar11 - ABS(fVar12);
  fVar13 = fVar13 - ABS(fVar4 - fVar8);
  if (fVar9 < fVar5) {
    fVar5 = fVar9;
  }
  if (fVar5 <= fVar11) {
    fVar11 = fVar5;
  }
  uVar3 = uVar7;
  if (fVar6 <= fVar10) {
    if (fVar6 <= fVar13) {
      fVar13 = fVar6;
    }
  }
  else if (fVar10 <= fVar13) {
    fVar13 = fVar10;
  }
LAB_0012482b:
  rVar14.height = fVar13;
  rVar14.width = fVar11;
  rVar14.x = (float)(int)uVar3;
  rVar14.y = (float)(int)((ulong)uVar3 >> 0x20);
  return rVar14;
}

Assistant:

rf_rec rf_get_collision_rec(rf_rec rec1, rf_rec rec2)
{
    rf_rec retRec = {0, 0, 0, 0};

    if (rf_check_collision_recs(rec1, rec2))
    {
        float dxx = (float) fabs(rec1.x - rec2.x);
        float dyy = (float) fabs(rec1.y - rec2.y);

        if (rec1.x <= rec2.x)
        {
            if (rec1.y <= rec2.y)
            {
                retRec.x = rec2.x;
                retRec.y = rec2.y;
                retRec.width = rec1.width - dxx;
                retRec.height = rec1.height - dyy;
            } else
            {
                retRec.x = rec2.x;
                retRec.y = rec1.y;
                retRec.width = rec1.width - dxx;
                retRec.height = rec2.height - dyy;
            }
        } else
        {
            if (rec1.y <= rec2.y)
            {
                retRec.x = rec1.x;
                retRec.y = rec2.y;
                retRec.width = rec2.width - dxx;
                retRec.height = rec1.height - dyy;
            } else
            {
                retRec.x = rec1.x;
                retRec.y = rec1.y;
                retRec.width = rec2.width - dxx;
                retRec.height = rec2.height - dyy;
            }
        }

        if (rec1.width > rec2.width)
        {
            if (retRec.width >= rec2.width) retRec.width = rec2.width;
        } else
        {
            if (retRec.width >= rec1.width) retRec.width = rec1.width;
        }

        if (rec1.height > rec2.height)
        {
            if (retRec.height >= rec2.height) retRec.height = rec2.height;
        } else
        {
            if (retRec.height >= rec1.height) retRec.height = rec1.height;
        }
    }

    return retRec;
}